

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetBindFlagString(Uint32 BindFlag)

{
  char *pcVar1;
  uint *in_RCX;
  uint *puVar2;
  uint in_EDI;
  string msg;
  uint local_2c;
  string local_28;
  
  local_2c = in_EDI;
  if ((in_EDI & in_EDI - 1) != 0) {
    FormatString<char[37]>(&local_28,(char (*) [37])"More than one bind flag is specified");
    in_RCX = (uint *)0x487;
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetBindFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x487);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  puVar2 = in_RCX;
  if ((int)local_2c < 0x20) {
    puVar2 = &switchD_002f7fa7::switchdataD_00361efc;
    switch(local_2c) {
    case 0:
      pcVar1 = "BIND_NONE";
      break;
    case 1:
      pcVar1 = "BIND_VERTEX_BUFFER";
      break;
    case 2:
      pcVar1 = "BIND_INDEX_BUFFER";
      break;
    case 4:
      pcVar1 = "BIND_UNIFORM_BUFFER";
      break;
    case 8:
      pcVar1 = "BIND_SHADER_RESOURCE";
      break;
    default:
      puVar2 = in_RCX;
      if (local_2c == 0x10) {
        return "BIND_STREAM_OUTPUT";
      }
    case 3:
    case 5:
    case 6:
    case 7:
switchD_002f7fa7_caseD_3:
      FormatString<char[22],unsigned_int>
                (&local_28,(Diligent *)"Unexpected bind flag ",(char (*) [22])&local_2c,puVar2);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"GetBindFlagString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x49c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = "";
    }
    return pcVar1;
  }
  if ((int)local_2c < 0x100) {
    if (local_2c == 0x20) {
      return "BIND_RENDER_TARGET";
    }
    if (local_2c == 0x40) {
      return "BIND_DEPTH_STENCIL";
    }
    if (local_2c == 0x80) {
      return "BIND_UNORDERED_ACCESS";
    }
  }
  else if ((int)local_2c < 0x400) {
    if (local_2c == 0x100) {
      return "BIND_INDIRECT_DRAW_ARGS";
    }
    if (local_2c == 0x200) {
      return "BIND_INPUT_ATTACHMENT";
    }
  }
  else {
    if (local_2c == 0x400) {
      return "BIND_RAY_TRACING";
    }
    if (local_2c == 0x800) {
      return "BIND_SHADING_RATE";
    }
  }
  goto switchD_002f7fa7_caseD_3;
}

Assistant:

const Char* GetBindFlagString(Uint32 BindFlag)
{
    VERIFY(BindFlag == BIND_NONE || IsPowerOfTwo(BindFlag), "More than one bind flag is specified");

    static_assert(BIND_FLAG_LAST == 0x800L, "Please handle the new bind flag in the switch below");
    switch (BindFlag)
    {
#define BIND_FLAG_STR_CASE(Flag) \
    case Flag: return #Flag;
        BIND_FLAG_STR_CASE(BIND_NONE)
        BIND_FLAG_STR_CASE(BIND_VERTEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_INDEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_UNIFORM_BUFFER)
        BIND_FLAG_STR_CASE(BIND_SHADER_RESOURCE)
        BIND_FLAG_STR_CASE(BIND_STREAM_OUTPUT)
        BIND_FLAG_STR_CASE(BIND_RENDER_TARGET)
        BIND_FLAG_STR_CASE(BIND_DEPTH_STENCIL)
        BIND_FLAG_STR_CASE(BIND_UNORDERED_ACCESS)
        BIND_FLAG_STR_CASE(BIND_INDIRECT_DRAW_ARGS)
        BIND_FLAG_STR_CASE(BIND_INPUT_ATTACHMENT)
        BIND_FLAG_STR_CASE(BIND_RAY_TRACING)
        BIND_FLAG_STR_CASE(BIND_SHADING_RATE)
#undef BIND_FLAG_STR_CASE
        default: UNEXPECTED("Unexpected bind flag ", BindFlag); return "";
    }
}